

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVError::NullPaddingFail
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          LinesPerBoundary error_info,string *current_path)

{
  ostream *poVar1;
  LinesPerBoundary error_info_p;
  string sStack_1e8;
  string local_1c8;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar1 = ::std::operator<<((ostream *)&error,
                             " The parallel scanner does not support null_padding in conjunction with quoted new lines. Please disable the parallel csv reader with parallel=false"
                            );
  ::std::operator<<(poVar1,'\n');
  CSVReaderOptions::ToString
            (&local_1c8,(CSVReaderOptions *)this,(string *)error_info.lines_in_batch);
  ::std::operator<<((ostream *)&error,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = error_info.boundary_idx;
  error_info_p.boundary_idx = (idx_t)options;
  CSVError(__return_storage_ptr__,&sStack_1e8,NULLPADDED_QUOTED_NEW_VALUE,error_info_p);
  ::std::__cxx11::string::~string((string *)&sStack_1e8);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::NullPaddingFail(const CSVReaderOptions &options, LinesPerBoundary error_info,
                                   const string &current_path) {
	std::ostringstream error;
	error << " The parallel scanner does not support null_padding in conjunction with quoted new lines. Please "
	         "disable the parallel csv reader with parallel=false"
	      << '\n';
	// What were the options
	error << options.ToString(current_path);
	return CSVError(error.str(), NULLPADDED_QUOTED_NEW_VALUE, error_info);
}